

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O2

void __thiscall OpenMD::TetrahedralityHBMatrix::process(TetrahedralityHBMatrix *this)

{
  SelectionManager *this_00;
  char cVar1;
  int iVar2;
  SimInfo *pSVar3;
  pointer pdVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Molecule *pMVar8;
  int whichFrame;
  Atom *pAVar9;
  int iVar10;
  ulong uVar11;
  pointer ppAVar12;
  pointer ppHVar13;
  HBondDonor *pHVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Molecule *local_14c8;
  Molecule *local_14c0;
  int ii;
  pointer local_1498;
  double local_1490;
  vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  myNeighbors;
  int jj;
  vector<double,_std::allocator<double>_> *local_1460;
  MoleculeIterator mi;
  Vector3d DA;
  Vector3d DH;
  Vector3d aPos;
  Vector3d dPos;
  pair<double,_OpenMD::Molecule_*> local_13d8;
  Vector3d HA;
  Vector3d hPos;
  Vector3d rik;
  Vector3d rk;
  Vector3d vec;
  Vector3d rkj;
  Vector<double,_3U> local_1330;
  Vector<double,_3U> local_1318;
  Vector3d rj;
  Vector3d ri;
  Vector3d uDA;
  Vector3d tposition;
  Vector3d dposition;
  DumpReader reader;
  
  mi._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&vec.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&ri.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rj.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rk.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rik.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rkj.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&dposition.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&tposition.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&dPos.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&aPos.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&hPos.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&DH.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&DA.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&HA.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&uDA.super_Vector<double,_3U>);
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar3 = (this->super_StaticAnalyser).info_;
  cVar1 = (pSVar3->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&reader,pSVar3,&(this->super_StaticAnalyser).dumpFilename_);
  iVar5 = DumpReader::getNFrames(&reader);
  local_1460 = &this->Q_;
  this_00 = &this->seleMan_;
  for (whichFrame = 0; whichFrame < iVar5;
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&reader,whichFrame);
    pSVar3 = (this->super_StaticAnalyser).info_;
    this->currentSnapshot_ = pSVar3->sman_->currentSnapshot_;
    pdVar4 = (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar4) {
      (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = pdVar4;
    }
    local_13d8.first = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (local_1460,(long)pSVar3->nGlobalMols_,&local_13d8.first);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_13d8,&this->evaluator_);
      SelectionManager::setSelectionSet(this_00,(SelectionSet *)&local_13d8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_13d8)
      ;
    }
    local_14c8 = SelectionManager::beginSelectedMolecule(this_00,&ii);
    while (local_14c8 != (Molecule *)0x0) {
      iVar2 = local_14c8->globalIndex_;
      if (myNeighbors.
          super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          myNeighbors.
          super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        myNeighbors.
        super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             myNeighbors.
             super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      pMVar8 = SimInfo::beginMolecule((this->super_StaticAnalyser).info_,&mi);
      while (pMVar8 != (Molecule *)0x0) {
        if (pMVar8->globalIndex_ != iVar2) {
          Molecule::getCom((Vector3d *)&local_1318,local_14c8);
          Molecule::getCom((Vector3d *)&local_1330,pMVar8);
          operator-((Vector<double,_3U> *)&local_13d8,&local_1318,&local_1330);
          Vector3<double>::operator=(&vec,(Vector<double,_3U> *)&local_13d8);
          if (cVar1 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&vec);
          }
          dVar15 = Vector<double,_3U>::length(&vec.super_Vector<double,_3U>);
          if (dVar15 < this->rCut_) {
            local_13d8.first = dVar15;
            local_13d8.second = pMVar8;
            std::
            vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>
            ::emplace_back<std::pair<double,OpenMD::Molecule*>>
                      ((vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>
                        *)&myNeighbors,&local_13d8);
          }
        }
        pMVar8 = SimInfo::nextMolecule((this->super_StaticAnalyser).info_,&mi);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::Molecule*>*,std::vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (myNeighbors.
                 super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 myNeighbors.
                 super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_1490 = (double)((ulong)((long)myNeighbors.
                                          super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)myNeighbors.
                                         super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
      iVar7 = SUB84(local_1490,0);
      uVar6 = iVar7 - 1;
      Molecule::getCom((Vector3d *)&local_13d8,local_14c8);
      Vector<double,_3U>::operator=(&rk.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
      iVar7 = (int)((double)(int)(uVar6 * iVar7) * 0.5);
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      iVar10 = 1;
      local_14c0 = (Molecule *)0x18;
      uVar11 = 0;
      local_14c8 = (Molecule *)0x3ff0000000000000;
      while (uVar11 != uVar6) {
        Molecule::getCom((Vector3d *)&local_13d8,
                         myNeighbors.
                         super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].second);
        Vector<double,_3U>::operator=
                  (&ri.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
        operator-((Vector<double,_3U> *)&local_13d8,&rk.super_Vector<double,_3U>,
                  &ri.super_Vector<double,_3U>);
        Vector3<double>::operator=(&rik,(Vector<double,_3U> *)&local_13d8);
        if (cVar1 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,&rik);
        }
        Vector<double,_3U>::normalize(&rik.super_Vector<double,_3U>);
        uVar11 = uVar11 + 1;
        local_1498 = (pointer)CONCAT44(local_1498._4_4_,iVar10);
        pMVar8 = local_14c0;
        for (; iVar10 < local_1490._0_4_; iVar10 = iVar10 + 1) {
          Molecule::getCom((Vector3d *)&local_13d8,
                           *(Molecule **)
                            ((long)&(myNeighbors.
                                     super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first +
                            (long)pMVar8));
          Vector<double,_3U>::operator=
                    (&rj.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
          operator-((Vector<double,_3U> *)&local_13d8,&rk.super_Vector<double,_3U>,
                    &rj.super_Vector<double,_3U>);
          Vector3<double>::operator=(&rkj,(Vector<double,_3U> *)&local_13d8);
          if (cVar1 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&rkj.super_Vector<double,_3U>);
          }
          Vector<double,_3U>::normalize(&rkj.super_Vector<double,_3U>);
          dVar15 = dot<double,3u>(&rik.super_Vector<double,_3U>,&rkj.super_Vector<double,_3U>);
          local_14c8 = (Molecule *)
                       ((double)local_14c8 +
                       ((dVar15 + 0.3333333333333333) * (dVar15 + 0.3333333333333333) * -9.0) /
                       ((double)iVar7 * 4.0));
          pMVar8 = (Molecule *)((long)pMVar8 + 0x10);
        }
        local_14c0 = (Molecule *)((long)local_14c0 + 0x10);
        iVar10 = (int)local_1498 + 1;
      }
      if (0 < iVar7) {
        (local_1460->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[iVar2] = (double)local_14c8;
      }
      local_14c8 = SelectionManager::nextSelectedMolecule(this_00,&ii);
    }
    local_14c0 = SelectionManager::beginSelectedMolecule(this_00,&ii);
    while (local_14c0 != (Molecule *)0x0) {
      pMVar8 = SelectionManager::beginSelectedMolecule(this_00,&jj);
      while (pMVar8 != (Molecule *)0x0) {
        local_1498 = (pointer)(local_14c0->hBondDonors_).
                              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start;
        if (local_1498 ==
            (pointer)(local_14c0->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
          pAVar9 = (Atom *)0x0;
        }
        else {
          pAVar9 = *local_1498;
        }
        while (pAVar9 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_13d8,
                              (StuntDouble *)(pAVar9->super_StuntDouble)._vptr_StuntDouble);
          Vector<double,_3U>::operator=
                    (&dPos.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
          StuntDouble::getPos((Vector3d *)&local_13d8,
                              &(*(Atom **)&(pAVar9->super_StuntDouble).objType_)->super_StuntDouble)
          ;
          Vector<double,_3U>::operator=
                    (&hPos.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
          operator-((Vector<double,_3U> *)&local_13d8,&hPos.super_Vector<double,_3U>,
                    &dPos.super_Vector<double,_3U>);
          Vector3<double>::operator=
                    ((Vector3<double> *)&DH.super_Vector<double,_3U>,
                     (Vector<double,_3U> *)&local_13d8);
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&DH.super_Vector<double,_3U>);
          dVar15 = Vector<double,_3U>::length(&DH.super_Vector<double,_3U>);
          ppAVar12 = (pMVar8->hBondAcceptors_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (ppAVar12 !=
              (pMVar8->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_00165273;
          pAVar9 = (Atom *)0x0;
          while (pAVar9 != (Atom *)0x0) {
            StuntDouble::getPos((Vector3d *)&local_13d8,&pAVar9->super_StuntDouble);
            Vector<double,_3U>::operator=
                      (&aPos.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
            operator-((Vector<double,_3U> *)&local_13d8,&aPos.super_Vector<double,_3U>,
                      &dPos.super_Vector<double,_3U>);
            Vector3<double>::operator=(&DA,(Vector<double,_3U> *)&local_13d8);
            Snapshot::wrapVector(this->currentSnapshot_,&DA);
            dVar16 = Vector<double,_3U>::length(&DA.super_Vector<double,_3U>);
            if (dVar16 < this->OOCut_) {
              operator-((Vector<double,_3U> *)&local_13d8,&aPos.super_Vector<double,_3U>,
                        &hPos.super_Vector<double,_3U>);
              Vector3<double>::operator=(&HA,(Vector<double,_3U> *)&local_13d8);
              Snapshot::wrapVector(this->currentSnapshot_,&HA);
              local_1490 = Vector<double,_3U>::length(&HA.super_Vector<double,_3U>);
              dVar17 = dot<double,3u>(&DH.super_Vector<double,_3U>,&DA.super_Vector<double,_3U>);
              dVar16 = acos(dVar17 / (dVar16 * dVar15));
              if (((dVar16 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
                 (local_1490 < this->OHCut_)) {
                pdVar4 = (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])
                          (pdVar4[local_14c0->globalIndex_],pdVar4[pMVar8->globalIndex_],this);
              }
            }
            ppAVar12 = ppAVar12 + 1;
            pAVar9 = (Atom *)0x0;
            if (ppAVar12 !=
                (pMVar8->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_00165273:
              pAVar9 = *ppAVar12;
            }
          }
          local_1498 = local_1498 + 1;
          pAVar9 = (Atom *)0x0;
          if (local_1498 !=
              (pointer)(local_14c0->hBondDonors_).
                       super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
            pAVar9 = *local_1498;
          }
        }
        ppAVar12 = (local_14c0->hBondAcceptors_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (ppAVar12 ==
            (local_14c0->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pAVar9 = (Atom *)0x0;
        }
        else {
          pAVar9 = *ppAVar12;
        }
        while (pAVar9 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_13d8,&pAVar9->super_StuntDouble);
          Vector<double,_3U>::operator=
                    (&aPos.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
          ppHVar13 = (pMVar8->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_1498 = ppAVar12;
          if (ppHVar13 !=
              (pMVar8->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001654d2;
          pHVar14 = (HBondDonor *)0x0;
          while (pHVar14 != (HBondDonor *)0x0) {
            StuntDouble::getPos((Vector3d *)&local_13d8,&pHVar14->donorAtom->super_StuntDouble);
            Vector<double,_3U>::operator=
                      (&dPos.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
            operator-((Vector<double,_3U> *)&local_13d8,&aPos.super_Vector<double,_3U>,
                      &dPos.super_Vector<double,_3U>);
            Vector3<double>::operator=(&DA,(Vector<double,_3U> *)&local_13d8);
            Snapshot::wrapVector(this->currentSnapshot_,&DA);
            dVar15 = Vector<double,_3U>::length(&DA.super_Vector<double,_3U>);
            if (dVar15 < this->OOCut_) {
              StuntDouble::getPos((Vector3d *)&local_13d8,
                                  &pHVar14->donatedHydrogen->super_StuntDouble);
              Vector<double,_3U>::operator=
                        (&hPos.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13d8);
              operator-((Vector<double,_3U> *)&local_13d8,&aPos.super_Vector<double,_3U>,
                        &hPos.super_Vector<double,_3U>);
              Vector3<double>::operator=(&HA,(Vector<double,_3U> *)&local_13d8);
              Snapshot::wrapVector(this->currentSnapshot_,&HA);
              dVar16 = Vector<double,_3U>::length(&HA.super_Vector<double,_3U>);
              operator-((Vector<double,_3U> *)&local_13d8,&hPos.super_Vector<double,_3U>,
                        &dPos.super_Vector<double,_3U>);
              Vector3<double>::operator=(&DH,(Vector<double,_3U> *)&local_13d8);
              Snapshot::wrapVector(this->currentSnapshot_,&DH);
              local_1490 = Vector<double,_3U>::length(&DH.super_Vector<double,_3U>);
              dVar17 = dot<double,3u>(&DH.super_Vector<double,_3U>,&DA.super_Vector<double,_3U>);
              dVar15 = acos(dVar17 / (dVar15 * local_1490));
              if (((dVar15 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
                 (dVar16 < this->OHCut_)) {
                pdVar4 = (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])
                          (pdVar4[pMVar8->globalIndex_],pdVar4[local_14c0->globalIndex_],this);
              }
            }
            ppHVar13 = ppHVar13 + 1;
            pHVar14 = (HBondDonor *)0x0;
            if (ppHVar13 !=
                (pMVar8->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001654d2:
              pHVar14 = *ppHVar13;
            }
          }
          ppAVar12 = local_1498 + 1;
          pAVar9 = (Atom *)0x0;
          if (ppAVar12 !=
              (local_14c0->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pAVar9 = *ppAVar12;
          }
        }
        pMVar8 = SelectionManager::nextSelectedMolecule(this_00,&jj);
      }
      local_14c0 = SelectionManager::nextSelectedMolecule(this_00,&ii);
    }
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[3])(this);
  DumpReader::~DumpReader(&reader);
  std::
  _Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  ::~_Vector_base(&myNeighbors.
                   super__Vector_base<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                 );
  return;
}

Assistant:

void TetrahedralityHBMatrix::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule* moli;
    Molecule* molj;
    SimInfo::MoleculeIterator mi;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj, dposition, tposition;
    RealType r, cospsi;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    Vector3d HA;
    Vector3d uDA;
    RealType DAdist, DHdist, HAdist, theta, ctheta, Qk, q1, q2;
    std::vector<std::pair<RealType, Molecule*>> myNeighbors;
    int myIndex, ii, jj, index1, index2;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Q_.clear();
      Q_.resize(info_->getNGlobalMolecules(), 0.0);

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected Molecules:

      for (mol1 = seleMan_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan_.nextSelectedMolecule(ii)) {
        myIndex = mol1->getGlobalIndex();

        Qk = 1.0;

        myNeighbors.clear();

        // inner loop is over all Molecules in the system:

        for (mol2 = info_->beginMolecule(mi); mol2 != NULL;
             mol2 = info_->nextMolecule(mi)) {
          if (mol2->getGlobalIndex() != myIndex) {
            vec = mol1->getCom() - mol2->getCom();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) { myNeighbors.push_back(std::make_pair(r, mol2)); }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:
        // int nbors =  myNeighbors.size()> 4 ? 4 : myNeighbors.size();
        int nbors = myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));

        rk = mol1->getCom();

        for (int i = 0; i < nbors - 1; i++) {
          moli = myNeighbors[i].second;
          ri   = moli->getCom();
          rik  = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            molj = myNeighbors[j].second;
            rj   = molj->getCom();
            rkj  = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from the actual number of nearest neighbors.
            Qk = Qk - (pow(cospsi + 1.0 / 3.0, 2) * 9.0 / (4.0 * nang));
          }
        }

        if (nang > 0) { Q_[myIndex] = Qk; }
      }
      // Now to scan for histogram:

      for (mol1 = seleMan_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan_.nextSelectedMolecule(ii)) {
        for (mol2 = seleMan_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
                 hba = mol2->nextHBondAcceptor(hbai)) {
              aPos = hba->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < OOCut_) {
                HA = aPos - hPos;
                currentSnapshot_->wrapVector(HA);
                HAdist = HA.length();

                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_ && HAdist < OHCut_) {
                  // We have a hydrogen bond!
                  index1 = mol1->getGlobalIndex();
                  index2 = mol2->getGlobalIndex();
                  q1     = Q_[index1];
                  q2     = Q_[index2];
                  collectHistogram(q1, q2);
                }
              }
            }
          }
          // now loop over the possible acceptors in molecule 1:
          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
                 hbd = mol2->nextHBondDonor(hbdi)) {
              dPos = hbd->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < OOCut_) {
                hPos = hbd->donatedHydrogen->getPos();
                HA   = aPos - hPos;
                currentSnapshot_->wrapVector(HA);
                HAdist = HA.length();

                DH = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_ && HAdist < OHCut_) {
                  // We have a hydrogen bond!
                  // keep these indexed by donor then acceptor:
                  index1 = mol2->getGlobalIndex();
                  index2 = mol1->getGlobalIndex();
                  q1     = Q_[index1];
                  q2     = Q_[index2];
                  collectHistogram(q1, q2);
                }
              }
            }
          }
        }
      }
    }
    writeOutput();
  }